

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

Own<kj::_::ImmediatePromiseNode<kj::_::Void>,_kj::_::PromiseDisposer> __thiscall
kj::_::PromiseDisposer::
alloc<kj::_::ImmediatePromiseNode<kj::_::Void>,kj::_::PromiseDisposer,kj::_::Void>
          (PromiseDisposer *this,Void *params)

{
  void *pvVar1;
  Void *params_00;
  PromiseArena *arena;
  ImmediatePromiseNode<kj::_::Void> *ptr;
  Void *params_local;
  
  pvVar1 = operator_new(0x400);
  params_00 = fwd<kj::_::Void>(params);
  ctor<kj::_::ImmediatePromiseNode<kj::_::Void>,kj::_::Void>
            ((ImmediatePromiseNode<kj::_::Void> *)((long)pvVar1 + 0x250),params_00);
  *(void **)((long)pvVar1 + 600) = pvVar1;
  Own<kj::_::ImmediatePromiseNode<kj::_::Void>,_kj::_::PromiseDisposer>::Own
            ((Own<kj::_::ImmediatePromiseNode<kj::_::Void>,_kj::_::PromiseDisposer> *)this,
             (ImmediatePromiseNode<kj::_::Void> *)((long)pvVar1 + 0x250));
  return (Own<kj::_::ImmediatePromiseNode<kj::_::Void>,_kj::_::PromiseDisposer>)
         (ImmediatePromiseNode<kj::_::Void> *)this;
}

Assistant:

static kj::Own<T, D> alloc(Params&&... params) noexcept {
    // Implements allocPromise().
    T* ptr;
    if (!canArenaAllocate<T>()) {
      // Node too big (or needs weird alignment), fall back to regular heap allocation.
      ptr = new T(kj::fwd<Params>(params)...);
    } else {
      // Start a new arena.
      //
      // NOTE: As in appendPromise() (below), we don't implement exception-safety because it causes
      //   code bloat and these constructors probably don't throw. Instead this function is
      //   noexcept, so if a constructor does throw, it'll crash rather than leak memory.
      auto* arena = new PromiseArena;
      ptr = reinterpret_cast<T*>(arena + 1) - 1;
      ctor(*ptr, kj::fwd<Params>(params)...);
      ptr->arena = arena;
      KJ_IREQUIRE(reinterpret_cast<void*>(ptr) ==
                  reinterpret_cast<void*>(static_cast<PromiseArenaMember*>(ptr)),
          "PromiseArenaMember must be the leftmost inherited type.");
    }
    return kj::Own<T, D>(ptr);
  }